

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

SPIREntryPoint * __thiscall diligent_spirv_cross::Compiler::get_entry_point(Compiler *this)

{
  pointer pvVar1;
  _Node_iterator_base<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>,_true>
  local_18;
  Compiler *local_10;
  Compiler *this_local;
  
  local_10 = this;
  local_18._M_cur =
       (__node_type *)
       ::std::
       unordered_map<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>_>_>
       ::find(&(this->ir).entry_points,&(this->ir).default_entry_point);
  pvVar1 = ::std::__detail::
           _Node_const_iterator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>,_false,_true>
           ::operator->((_Node_const_iterator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>,_false,_true>
                         *)&local_18);
  return &pvVar1->second;
}

Assistant:

const SPIREntryPoint &Compiler::get_entry_point() const
{
	return ir.entry_points.find(ir.default_entry_point)->second;
}